

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O1

Gia_Man_t * Lf_ManDeriveMappingGia(Lf_Man_t *p)

{
  int iVar1;
  Jf_Par_t *pJVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  undefined8 uVar5;
  Vec_Mem_t *pVVar6;
  long lVar7;
  uint uVar8;
  byte bVar9;
  int iVar10;
  int *piVar11;
  undefined4 *__s;
  Vec_Int_t *p_00;
  int *piVar12;
  Vec_Int_t *p_01;
  int *__s_00;
  Vec_Int_t *vMemory;
  Vec_Int_t *p_02;
  Gia_Man_t *p_03;
  size_t sVar13;
  char *pcVar14;
  Gia_Man_t *pGVar15;
  Gia_Obj_t *pGVar16;
  Lf_Cut_t *pLVar17;
  ulong uVar18;
  ulong *puVar19;
  ulong uVar20;
  word *pwVar21;
  uint uVar22;
  int iVar23;
  int Fill;
  int Fill_00;
  int Fill_01;
  int Fill_02;
  long lVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  word *pwVar28;
  int iVar29;
  uint uVar30;
  word *pTruth;
  long lVar31;
  bool bVar32;
  word *pLimit;
  int pVarsNew [12];
  word pTruthCof [64];
  uint local_2a0 [2];
  word *local_298;
  ulong local_290;
  ulong *local_288;
  ulong local_280;
  long local_278;
  ulong local_270;
  int local_268 [12];
  word local_238 [65];
  
  pGVar15 = p->pGia;
  iVar23 = pGVar15->nObjs;
  piVar11 = (int *)malloc(0x10);
  iVar10 = iVar23;
  if (iVar23 - 1U < 0xf) {
    iVar10 = 0x10;
  }
  piVar11[1] = 0;
  *piVar11 = iVar10;
  if (iVar10 == 0) {
    __s = (undefined4 *)0x0;
  }
  else {
    __s = (undefined4 *)malloc((long)iVar10 << 2);
  }
  *(undefined4 **)(piVar11 + 2) = __s;
  piVar11[1] = iVar23;
  memset(__s,0xff,(long)iVar23 << 2);
  pJVar2 = p->pPars;
  iVar29 = (pGVar15->nObjs + (int)pJVar2->Area) * 2 + (int)pJVar2->Edge;
  iVar1 = (int)pJVar2->Mux7;
  iVar10 = iVar29 + iVar1 * 4;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar25 = 0x10;
  if (0xe < (iVar29 + iVar1 * 4) - 1U) {
    iVar25 = iVar10;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar25;
  if (iVar25 == 0) {
    piVar12 = (int *)0x0;
  }
  else {
    piVar12 = (int *)malloc((long)iVar25 << 2);
  }
  p_00->pArray = piVar12;
  p_00->nSize = iVar10;
  __s_00 = (int *)0x0;
  memset(piVar12,0,(long)iVar10 << 2);
  iVar10 = (int)pJVar2->Area;
  iVar1 = (int)pJVar2->Edge;
  iVar29 = iVar1 + iVar10 * 2 + 1000;
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar25 = 0x10;
  if (0xe < iVar1 + iVar10 * 2 + 999U) {
    iVar25 = iVar29;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar25;
  if (iVar25 != 0) {
    __s_00 = (int *)malloc((long)iVar25 << 2);
  }
  p_01->pArray = __s_00;
  p_01->nSize = iVar29;
  memset(__s_00,0,(long)iVar29 << 2);
  vMemory = (Vec_Int_t *)malloc(0x10);
  vMemory->nCap = 0x10000;
  vMemory->nSize = 0;
  piVar12 = (int *)malloc(0x40000);
  vMemory->pArray = piVar12;
  p_02 = (Vec_Int_t *)malloc(0x10);
  p_02->nCap = 0x10;
  p_02->nSize = 0;
  piVar12 = (int *)malloc(0x40);
  p_02->pArray = piVar12;
  if (pJVar2->fCutMin == 0) {
    __assert_fail("p->pPars->fCutMin",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                  ,0x71c,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
  }
  p_03 = Gia_ManStart(pGVar15->nObjs);
  pGVar15 = p->pGia;
  pcVar3 = pGVar15->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar14 = (char *)0x0;
  }
  else {
    sVar13 = strlen(pcVar3);
    pcVar14 = (char *)malloc(sVar13 + 1);
    strcpy(pcVar14,pcVar3);
  }
  p_03->pName = pcVar14;
  pcVar3 = pGVar15->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar14 = (char *)0x0;
  }
  else {
    sVar13 = strlen(pcVar3);
    pcVar14 = (char *)malloc(sVar13 + 1);
    strcpy(pcVar14,pcVar3);
  }
  p_03->pSpec = pcVar14;
  if (iVar23 < 1) {
LAB_00712906:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  *__s = 0;
  pGVar15 = p->pGia;
  uVar20 = (ulong)(uint)pGVar15->nObjs;
  if (1 < pGVar15->nObjs) {
    lVar26 = 1;
    do {
      pGVar4 = pGVar15->pObjs;
      uVar5 = *(undefined8 *)(pGVar4 + lVar26);
      uVar30 = (uint)uVar5;
      if ((uVar30 & 0x9fffffff) == 0x9fffffff) {
        pGVar16 = Gia_ManAppendObj(p_03);
        uVar20 = *(ulong *)pGVar16;
        *(ulong *)pGVar16 = uVar20 | 0x9fffffff;
        *(ulong *)pGVar16 =
             uVar20 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_03->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = p_03->pObjs;
        if ((pGVar16 < pGVar4) || (pGVar4 + p_03->nObjs <= pGVar16)) {
LAB_007128e7:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_03->vCis,(int)((ulong)((long)pGVar16 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = p_03->pObjs;
        if ((pGVar16 < pGVar4) || (pGVar4 + p_03->nObjs <= pGVar16)) goto LAB_007128e7;
        if (piVar11[1] <= lVar26) goto LAB_00712906;
        *(int *)(*(long *)(piVar11 + 2) + lVar26 * 4) =
             (int)((ulong)((long)pGVar16 - (long)pGVar4) >> 2) * 0x55555556;
      }
      else {
        iVar23 = (int)lVar26;
        if ((~uVar30 & 0x1fffffff) == 0 || -1 < (int)uVar30) {
          if ((((int)uVar30 < 0) || (uVar22 = uVar30 & 0x1fffffff, uVar22 == 0x1fffffff)) ||
             (uVar22 != ((uint)((ulong)uVar5 >> 0x20) & 0x1fffffff))) {
            if ((p->vOffsets).nSize <= lVar26) {
LAB_007128a9:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar10 = (p->vOffsets).pArray[lVar26];
            if (((long)iVar10 < 0) || ((p->vMapRefs).nSize <= iVar10)) goto LAB_007128a9;
            if ((p->vMapRefs).pArray[iVar10] != 0) {
              pLVar17 = Lf_ObjCutBest(p,iVar23);
              uVar30 = pLVar17->iFunc;
              if ((int)uVar30 < 0) {
                __assert_fail("pCut->iFunc >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                              ,0x739,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
              }
              uVar22 = *(uint *)&pLVar17->field_0x14;
              if (uVar22 < 0x1000000) {
                if (1 < uVar30) {
                  __assert_fail("Abc_Lit2Var(pCut->iFunc) == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                                ,0x73c,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
                }
                if (piVar11[1] <= lVar26) goto LAB_00712906;
              }
              else {
                if ((uVar22 & 0xff000000) == 0x1000000) {
                  if ((uVar30 & 0x7ffffffe) != 2) {
                    __assert_fail("Abc_Lit2Var(pCut->iFunc) == 1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                                  ,0x742,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
                  }
                  iVar23 = (int)pLVar17[1].Sign;
                  if (((long)iVar23 < 0) || (piVar11[1] <= iVar23)) goto LAB_007128a9;
                  uVar22 = *(uint *)(*(long *)(piVar11 + 2) + (long)iVar23 * 4);
                  if ((int)uVar22 < 0) goto LAB_00712925;
                  if (lVar26 < piVar11[1]) {
                    *(uint *)(*(long *)(piVar11 + 2) + lVar26 * 4) = uVar22 ^ uVar30 & 1;
                    goto LAB_00711dcd;
                  }
                  goto LAB_00712906;
                }
                uVar30 = p->pPars->nLutSizeMux;
                if ((uVar30 == 0) || (uVar22 = uVar22 >> 0x18, uVar30 != uVar22)) {
                  p_02->nSize = 0;
                  uVar30 = *(uint *)&pLVar17->field_0x14;
                  if ((uVar30 >> 0x17 & 1) == 0) {
                    if (0xffffff < uVar30) {
                      uVar20 = 0;
                      do {
                        iVar23 = *(int *)((long)&pLVar17[1].Sign + uVar20 * 4);
                        if (((long)iVar23 < 0) || (piVar11[1] <= iVar23)) goto LAB_007128a9;
                        Vec_IntPush(p_02,*(int *)(*(long *)(piVar11 + 2) + (long)iVar23 * 4));
                        uVar20 = uVar20 + 1;
                      } while (uVar20 < (byte)pLVar17->field_0x17);
                    }
                  }
                  else {
                    if ((uVar30 & 0xff000000) != 0x3000000) {
                      __assert_fail("pCut->nLeaves == 3",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                                    ,0x6fd,
                                    "int Lf_ManDerivePart(Lf_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Lf_Cut_t *, Vec_Int_t *, Vec_Int_t *, Gia_Obj_t *)"
                                   );
                    }
                    iVar23 = (int)pLVar17[1].Sign;
                    if (((long)iVar23 < 0) || (iVar10 = piVar11[1], iVar10 <= iVar23))
                    goto LAB_007128a9;
                    lVar24 = *(long *)(piVar11 + 2);
                    uVar30 = *(uint *)(lVar24 + (long)iVar23 * 4);
                    if ((int)uVar30 < 0) goto LAB_00712925;
                    pGVar4 = pGVar4 + lVar26;
                    Vec_IntPush(p_02,*(uint *)pGVar4 >> 0x1d & 1 ^ uVar30);
                    iVar23 = *(int *)((long)&pLVar17[1].Sign + 4);
                    if (((long)iVar23 < 0) || (iVar10 <= iVar23)) goto LAB_007128a9;
                    uVar30 = *(uint *)(lVar24 + (long)iVar23 * 4);
                    if ((int)uVar30 < 0) goto LAB_00712925;
                    Vec_IntPush(p_02,(uint)((ulong)*(undefined8 *)pGVar4 >> 0x3d) & 1 ^ uVar30);
                    iVar23 = pLVar17[1].Delay;
                    if (((long)iVar23 < 0) || (iVar10 <= iVar23)) goto LAB_007128a9;
                    uVar30 = *(uint *)(lVar24 + (long)iVar23 * 4);
                    pGVar15 = p->pGia;
                    if (pGVar15->pMuxes == (uint *)0x0) {
                      uVar22 = 0;
                    }
                    else {
                      pGVar16 = pGVar15->pObjs;
                      if ((pGVar4 < pGVar16) || (pGVar16 + pGVar15->nObjs <= pGVar4))
                      goto LAB_007128e7;
                      uVar22 = pGVar15->pMuxes
                               [(int)((ulong)((long)pGVar4 - (long)pGVar16) >> 2) * -0x55555555];
                      if ((int)uVar22 < 0) goto LAB_007129fe;
                      uVar22 = uVar22 & 1;
                    }
                    if ((int)uVar30 < 0) goto LAB_00712925;
                    Vec_IntPush(p_02,uVar22 ^ uVar30);
                  }
                  if (pLVar17->iFunc < 0) goto LAB_007128c8;
                  pVVar6 = p->vTtMem;
                  uVar30 = (uint)pLVar17->iFunc >> 1;
                  if (pVVar6->nEntries <= (int)uVar30) goto LAB_00712a1d;
                  uVar30 = Kit_TruthToGia(p_03,(uint *)(pVVar6->ppPages
                                                        [uVar30 >> ((byte)pVVar6->LogPageSze & 0x1f)
                                                        ] + (ulong)(uVar30 & pVVar6->PageMask) *
                                                            (long)pVVar6->nEntrySize),p_02->nSize,
                                          vMemory,p_02,0);
                  if ((int)uVar30 < 0) goto LAB_007128c8;
                  uVar22 = uVar30 >> 1;
                  iVar23 = p_01->nSize;
                  Vec_IntFillExtra(p_00,uVar22 + 1,Fill_01);
                  if (p_00->nSize <= (int)uVar22) goto LAB_00712906;
                  p_00->pArray[uVar22] = iVar23;
                  Vec_IntPush(p_01,p_02->nSize);
                  if (0 < p_02->nSize) {
                    lVar24 = 0;
                    do {
                      if (p_02->pArray[lVar24] < 0) goto LAB_007128c8;
                      Vec_IntPush(p_01,(uint)p_02->pArray[lVar24] >> 1);
                      lVar24 = lVar24 + 1;
                    } while (lVar24 < p_02->nSize);
                  }
                  uVar8 = -uVar22;
                  if ((*(uint *)&pLVar17->field_0x14 >> 0x17 & 1) == 0) {
                    uVar8 = uVar22;
                  }
                  Vec_IntPush(p_01,uVar8);
                }
                else {
                  if (pLVar17->iFunc < 0) {
LAB_007128c8:
                    __assert_fail("Lit >= 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                  ,0xf2,"int Abc_Lit2Var(int)");
                  }
                  pVVar6 = p->vTtMem;
                  uVar30 = (uint)pLVar17->iFunc >> 1;
                  if (pVVar6->nEntries <= (int)uVar30) {
LAB_00712a1d:
                    __assert_fail("i >= 0 && i < p->nEntries",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecMem.h"
                                  ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
                  }
                  pTruth = pVVar6->ppPages[uVar30 >> ((byte)pVVar6->LogPageSze & 0x1f)] +
                           (ulong)(uVar30 & pVVar6->PageMask) * (long)pVVar6->nEntrySize;
                  uVar30 = p->pPars->nLutSize;
                  local_280 = (ulong)uVar30;
                  uVar8 = 1 << ((char)uVar30 - 6U & 0x1f);
                  if ((int)uVar30 < 7) {
                    uVar8 = 1;
                  }
                  uVar30 = Lf_ManFindCofVar(pTruth,uVar8,uVar22);
                  if (uVar22 <= uVar30) {
                    __assert_fail("iVar >= 0 && iVar < (int)pCut->nLeaves",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                                  ,0x6d4,
                                  "int Lf_ManDerivePart(Lf_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Lf_Cut_t *, Vec_Int_t *, Vec_Int_t *, Gia_Obj_t *)"
                                 );
                  }
                  iVar10 = uVar30 - 6;
                  uVar22 = 1 << ((byte)iVar10 & 0x1f);
                  iVar23 = 2 << ((byte)iVar10 & 0x1f);
                  uVar20 = 1;
                  if (1 < (int)uVar22) {
                    uVar20 = (ulong)uVar22;
                  }
                  local_290 = (ulong)(uint)(1 << ((byte)uVar30 & 0x1f));
                  local_298 = local_238 + (int)uVar22;
                  local_278 = (long)(int)uVar22 << 3;
                  lVar24 = 0;
                  local_288 = pTruth;
                  do {
                    uVar22 = *(uint *)&pLVar17->field_0x14 >> 0x18;
                    if (0xffffff < *(uint *)&pLVar17->field_0x14) {
                      uVar18 = 0;
                      do {
                        local_268[uVar18] = (int)uVar18;
                        uVar18 = uVar18 + 1;
                      } while (uVar22 != uVar18);
                    }
                    bVar9 = (byte)local_290;
                    if (lVar24 == 0) {
                      if (uVar8 == 1) {
                        uVar18 = s_Truths6Neg[(int)uVar30] & *local_288;
                        local_238[0] = uVar18 << (bVar9 & 0x3f);
                        goto LAB_00712099;
                      }
                      if ((int)uVar30 < 6) {
                        if (0 < (int)uVar8) {
                          uVar18 = s_Truths6Neg[(int)uVar30];
                          uVar27 = 0;
                          do {
                            local_238[uVar27] =
                                 (local_288[uVar27] & uVar18) << (bVar9 & 0x3f) |
                                 local_288[uVar27] & uVar18;
                            uVar27 = uVar27 + 1;
                          } while (uVar8 != uVar27);
                        }
                      }
                      else if (0 < (int)uVar8) {
                        pwVar21 = local_238;
                        puVar19 = local_288;
                        pwVar28 = local_298;
                        do {
                          if (iVar10 != 0x1f) {
                            uVar18 = 0;
                            do {
                              pwVar21[uVar18] = puVar19[uVar18];
                              pwVar28[uVar18] = puVar19[uVar18];
                              uVar18 = uVar18 + 1;
                            } while (uVar20 != uVar18);
                          }
                          puVar19 = puVar19 + iVar23;
                          pwVar28 = pwVar28 + iVar23;
                          pwVar21 = pwVar21 + iVar23;
                        } while (puVar19 < pTruth + (int)uVar8);
                      }
                    }
                    else if (uVar8 == 1) {
                      uVar18 = s_Truths6[(int)uVar30] & *local_288;
                      local_238[0] = uVar18 >> (bVar9 & 0x3f);
LAB_00712099:
                      local_238[0] = local_238[0] | uVar18;
                    }
                    else if ((int)uVar30 < 6) {
                      if (0 < (int)uVar8) {
                        uVar18 = s_Truths6[(int)uVar30];
                        uVar27 = 0;
                        do {
                          local_238[uVar27] =
                               (local_288[uVar27] & uVar18) >> (bVar9 & 0x3f) |
                               local_288[uVar27] & uVar18;
                          uVar27 = uVar27 + 1;
                        } while (uVar8 != uVar27);
                      }
                    }
                    else if (0 < (int)uVar8) {
                      pwVar21 = local_238;
                      puVar19 = local_288;
                      do {
                        if (iVar10 != 0x1f) {
                          uVar18 = 0;
                          do {
                            pwVar21[uVar18] = *(word *)((long)puVar19 + uVar18 * 8 + local_278);
                            *(undefined8 *)((long)pwVar21 + uVar18 * 8 + local_278) =
                                 *(undefined8 *)((long)puVar19 + uVar18 * 8 + local_278);
                            uVar18 = uVar18 + 1;
                          } while (uVar20 != uVar18);
                        }
                        puVar19 = puVar19 + iVar23;
                        pwVar21 = pwVar21 + iVar23;
                      } while (puVar19 < pTruth + (int)uVar8);
                    }
                    uVar22 = Abc_TtMinBase(local_238,local_268,uVar22,(int)local_280);
                    if ((int)uVar22 < 1) {
                      __assert_fail("nVarsNew > 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                                    ,0x6de,
                                    "int Lf_ManDerivePart(Lf_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Lf_Cut_t *, Vec_Int_t *, Vec_Int_t *, Gia_Obj_t *)"
                                   );
                    }
                    p_02->nSize = 0;
                    uVar18 = 0;
                    do {
                      iVar1 = *(int *)((long)&pLVar17[1].Sign + (long)local_268[uVar18] * 4);
                      if (((long)iVar1 < 0) || (iVar25 = piVar11[1], iVar25 <= iVar1))
                      goto LAB_007128a9;
                      lVar7 = *(long *)(piVar11 + 2);
                      Vec_IntPush(p_02,*(int *)(lVar7 + (long)iVar1 * 4));
                      uVar18 = uVar18 + 1;
                    } while (uVar22 != uVar18);
                    uVar22 = Kit_TruthToGia(p_03,(uint *)local_238,uVar22,vMemory,p_02,0);
                    local_2a0[lVar24] = uVar22;
                    if ((int)uVar22 < 0) goto LAB_007128c8;
                    uVar22 = uVar22 >> 1;
                    iVar1 = p_01->nSize;
                    Vec_IntFillExtra(p_00,uVar22 + 1,Fill);
                    if (p_00->nSize <= (int)uVar22) goto LAB_00712906;
                    p_00->pArray[uVar22] = iVar1;
                    local_270 = (ulong)uVar22;
                    Vec_IntPush(p_01,p_02->nSize);
                    if (0 < p_02->nSize) {
                      lVar31 = 0;
                      do {
                        if (p_02->pArray[lVar31] < 0) goto LAB_007128c8;
                        Vec_IntPush(p_01,(uint)p_02->pArray[lVar31] >> 1);
                        lVar31 = lVar31 + 1;
                      } while (lVar31 < p_02->nSize);
                    }
                    Vec_IntPush(p_01,(int)local_270);
                    bVar32 = lVar24 == 0;
                    lVar24 = lVar24 + 1;
                  } while (bVar32);
                  local_238[0] = 0xcacacacacacacaca;
                  p_02->nSize = 0;
                  Vec_IntPush(p_02,local_2a0[0]);
                  Vec_IntPush(p_02,local_2a0[1]);
                  iVar23 = *(int *)((long)&pLVar17[1].Sign + (ulong)uVar30 * 4);
                  if (((long)iVar23 < 0) || (iVar25 <= iVar23)) goto LAB_007128a9;
                  Vec_IntPush(p_02,*(int *)(lVar7 + (long)iVar23 * 4));
                  uVar30 = Kit_TruthToGia(p_03,(uint *)local_238,p_02->nSize,vMemory,p_02,0);
                  if ((int)uVar30 < 0) goto LAB_007128c8;
                  uVar22 = uVar30 >> 1;
                  iVar23 = p_01->nSize;
                  Vec_IntFillExtra(p_00,uVar22 + 1,Fill_00);
                  if (p_00->nSize <= (int)uVar22) goto LAB_00712906;
                  p_00->pArray[uVar22] = iVar23;
                  Vec_IntPush(p_01,p_02->nSize);
                  if (0 < p_02->nSize) {
                    lVar24 = 0;
                    do {
                      if (p_02->pArray[lVar24] < 0) goto LAB_007128c8;
                      Vec_IntPush(p_01,(uint)p_02->pArray[lVar24] >> 1);
                      lVar24 = lVar24 + 1;
                    } while (lVar24 < p_02->nSize);
                  }
                  Vec_IntPush(p_01,-uVar22);
                }
                if (pLVar17->iFunc < 0) {
LAB_007129fe:
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                ,0xf3,"int Abc_LitIsCompl(int)");
                }
                if ((int)uVar30 < 0) {
LAB_00712925:
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                ,0xf5,"int Abc_LitNotCond(int, int)");
                }
                if (piVar11[1] <= lVar26) goto LAB_00712906;
                uVar30 = pLVar17->iFunc & 1U ^ uVar30;
              }
              *(uint *)(*(long *)(piVar11 + 2) + lVar26 * 4) = uVar30;
            }
          }
          else {
            if ((int)uVar20 <= lVar26) goto LAB_007128e7;
            uVar22 = iVar23 - uVar22;
            if (((int)uVar22 < 0) || (iVar23 = piVar11[1], iVar23 <= (int)uVar22))
            goto LAB_007128a9;
            lVar24 = *(long *)(piVar11 + 2);
            uVar22 = *(uint *)(lVar24 + (ulong)uVar22 * 4);
            if ((int)uVar22 < 0) goto LAB_00712925;
            iVar10 = Gia_ManAppendBuf(p_03,uVar22 ^ uVar30 >> 0x1d & 1);
            if (iVar23 <= lVar26) goto LAB_00712906;
            *(int *)(lVar24 + lVar26 * 4) = iVar10;
          }
        }
        else {
          if ((int)uVar20 <= lVar26) goto LAB_007128e7;
          uVar22 = iVar23 - (uVar30 & 0x1fffffff);
          if (((int)uVar22 < 0) || (piVar11[1] <= (int)uVar22)) goto LAB_007128a9;
          uVar22 = *(uint *)(*(long *)(piVar11 + 2) + (ulong)uVar22 * 4);
          if ((int)uVar22 < 0) goto LAB_00712925;
          Gia_ManAppendCo(p_03,uVar22 ^ uVar30 >> 0x1d & 1);
        }
      }
LAB_00711dcd:
      lVar26 = lVar26 + 1;
      pGVar15 = p->pGia;
      uVar20 = (ulong)pGVar15->nObjs;
    } while (lVar26 < (long)uVar20);
  }
  if (*(void **)(piVar11 + 2) != (void *)0x0) {
    free(*(void **)(piVar11 + 2));
    piVar11[2] = 0;
    piVar11[3] = 0;
  }
  free(piVar11);
  if (vMemory->pArray != (int *)0x0) {
    free(vMemory->pArray);
    vMemory->pArray = (int *)0x0;
  }
  free(vMemory);
  if (p_02->pArray != (int *)0x0) {
    free(p_02->pArray);
    p_02->pArray = (int *)0x0;
  }
  free(p_02);
  iVar23 = p_03->nObjs;
  if (iVar23 < p_00->nSize) {
    p_00->nSize = iVar23;
  }
  else {
    Vec_IntFillExtra(p_00,iVar23,Fill_02);
  }
  if (p_00->nSize != p_03->nObjs) {
    __assert_fail("Vec_IntSize(vMapping) == Gia_ManObjNum(pNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                  ,0x752,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
  }
  if (0 < p_00->nSize) {
    piVar11 = p_00->pArray;
    lVar26 = 0;
    do {
      iVar23 = piVar11[lVar26];
      if (0 < iVar23) {
        piVar11[lVar26] = iVar23 + p_03->nObjs;
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 < p_00->nSize);
  }
  iVar23 = p_01->nSize;
  if (0 < (long)iVar23) {
    piVar11 = p_01->pArray;
    lVar26 = 0;
    do {
      Vec_IntPush(p_00,piVar11[lVar26]);
      lVar26 = lVar26 + 1;
    } while (iVar23 != lVar26);
  }
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  if (p_03->vMapping != (Vec_Int_t *)0x0) {
    __assert_fail("pNew->vMapping == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                  ,0x759,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
  }
  p_03->vMapping = p_00;
  Gia_ManSetRegNum(p_03,p->pGia->nRegs);
  return p_03;
}

Assistant:

Gia_Man_t * Lf_ManDeriveMappingGia( Lf_Man_t * p )
{
    Gia_Man_t * pNew; 
    Gia_Obj_t * pObj; 
    Vec_Int_t * vCopies   = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vMapping  = Vec_IntStart( 2*Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + 2*(int)p->pPars->Area + 4*(int)p->pPars->Mux7 );
    Vec_Int_t * vMapping2 = Vec_IntStart( (int)p->pPars->Edge + 2*(int)p->pPars->Area + 1000 );
    Vec_Int_t * vCover    = Vec_IntAlloc( 1 << 16 );
    Vec_Int_t * vLeaves   = Vec_IntAlloc( 16 );
    Lf_Cut_t * pCut;
    int i, iLit; 
    assert( p->pPars->fCutMin );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p->pGia) );
    pNew->pName = Abc_UtilStrsav( p->pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pGia->pSpec );
    Vec_IntWriteEntry( vCopies, 0, 0 );
    Gia_ManForEachObj1( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
        {
            Vec_IntWriteEntry( vCopies, i, Gia_ManAppendCi(pNew) );
            continue;
        }
        if ( Gia_ObjIsCo(pObj) )
        {
            iLit = Vec_IntEntry( vCopies, Gia_ObjFaninId0p(p->pGia, pObj) );
            iLit = Gia_ManAppendCo( pNew, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
            continue;
        }
        if ( Gia_ObjIsBuf(pObj) )
        {
            iLit = Vec_IntEntry( vCopies, Gia_ObjFaninId0p(p->pGia, pObj) );
            iLit = Gia_ManAppendBuf( pNew, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
            Vec_IntWriteEntry( vCopies, i, iLit );
            continue;
        }
        if ( !Lf_ObjMapRefNum(p, i) )
            continue;
        pCut = Lf_ObjCutBest( p, i );
        assert( pCut->iFunc >= 0 );
        if ( pCut->nLeaves == 0 )
        {
            assert( Abc_Lit2Var(pCut->iFunc) == 0 );
            Vec_IntWriteEntry( vCopies, i, pCut->iFunc );
            continue;
        }
        if ( pCut->nLeaves == 1 )
        {
            assert( Abc_Lit2Var(pCut->iFunc) == 1 );
            iLit = Vec_IntEntry( vCopies, pCut->pLeaves[0] );
            Vec_IntWriteEntry( vCopies, i, Abc_LitNotCond(iLit, Abc_LitIsCompl(pCut->iFunc)) );
            continue;
        }
        iLit = Lf_ManDerivePart( p, pNew, vMapping, vMapping2, vCopies, pCut, vLeaves, vCover, pObj );
        Vec_IntWriteEntry( vCopies, i, Abc_LitNotCond(iLit, Abc_LitIsCompl(pCut->iFunc)) );
    }
    Vec_IntFree( vCopies );
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    // finish mapping 
    if ( Vec_IntSize(vMapping) > Gia_ManObjNum(pNew) )
        Vec_IntShrink( vMapping, Gia_ManObjNum(pNew) );
    else
        Vec_IntFillExtra( vMapping, Gia_ManObjNum(pNew), 0 );
    assert( Vec_IntSize(vMapping) == Gia_ManObjNum(pNew) );
    Vec_IntForEachEntry( vMapping, iLit, i )
        if ( iLit > 0 )
            Vec_IntAddToEntry( vMapping, i, Gia_ManObjNum(pNew) );
    Vec_IntAppend( vMapping, vMapping2 );
    Vec_IntFree( vMapping2 );
    // attach mapping and packing
    assert( pNew->vMapping == NULL );
    pNew->vMapping = vMapping;
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p->pGia) );
    return pNew;
}